

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

int mz_zip_reader_locate_file(mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags)

{
  byte bVar1;
  ushort uVar2;
  mz_uint32 mVar3;
  uint uVar4;
  mz_zip_internal_state *pmVar5;
  void *pvVar6;
  void *pvVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  size_t __n;
  ulong uVar11;
  size_t sVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  byte *pbVar18;
  byte *pbVar19;
  ulong uVar20;
  byte *pbVar21;
  ulong uVar22;
  byte bVar23;
  void *__s2;
  int iVar24;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return -1;
  }
  pmVar5 = pZip->m_pState;
  if (pName == (char *)0x0 || pmVar5 == (mz_zip_internal_state *)0x0) {
    return -1;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_READING) {
    return -1;
  }
  if ((pComment == (char *)0x0 && (flags & 0x300) == 0) &&
     ((pmVar5->m_sorted_central_dir_offsets).m_size != 0)) {
    mVar3 = pZip->m_total_files;
    pvVar6 = (pmVar5->m_sorted_central_dir_offsets).m_p;
    sVar10 = strlen(pName);
    if (0 < (int)mVar3) {
      iVar24 = mVar3 - 1;
      pvVar7 = (pmVar5->m_central_dir).m_p;
      iVar15 = 0;
      do {
        uVar17 = (uint)(iVar24 + iVar15) >> 1;
        uVar4 = *(uint *)((long)pvVar6 + (ulong)uVar17 * 4);
        uVar22 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + (ulong)uVar4 * 4);
        pbVar18 = (byte *)((long)pvVar7 + uVar22 + 0x2e);
        uVar2 = *(ushort *)((long)pvVar7 + uVar22 + 0x1c);
        uVar20 = (ulong)uVar2;
        if ((uint)sVar10 <= (uint)uVar2) {
          uVar20 = sVar10 & 0xffffffff;
        }
        pbVar19 = (byte *)((long)pvVar7 + uVar20 + uVar22 + 0x2e);
        pbVar21 = (byte *)pName;
        if ((int)uVar20 == 0) {
          iVar14 = 0;
        }
        else {
          do {
            bVar1 = *pbVar18;
            bVar13 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar13 = bVar1;
            }
            bVar1 = *pbVar21;
            bVar23 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar23 = bVar1;
            }
            if (bVar13 != bVar23) break;
            pbVar18 = pbVar18 + 1;
            pbVar21 = pbVar21 + 1;
            bVar23 = bVar13;
          } while (pbVar18 < pbVar19);
          iVar14 = (uint)bVar13 - (uint)bVar23;
        }
        if (pbVar18 == pbVar19) {
          iVar14 = (uint)uVar2 - (uint)sVar10;
        }
        if (iVar14 == 0) {
          return uVar4;
        }
        iVar9 = uVar17 - 1;
        if (iVar14 < 0) {
          iVar15 = uVar17 + 1;
          iVar9 = iVar24;
        }
        iVar24 = iVar9;
      } while (iVar15 <= iVar24);
    }
  }
  else {
    sVar10 = strlen(pName);
    if (sVar10 < 0x10000) {
      if (pComment == (char *)0x0) {
        __n = 0;
      }
      else {
        __n = strlen(pComment);
        if (0xffff < __n) {
          return -1;
        }
      }
      uVar4 = pZip->m_total_files;
      if ((ulong)uVar4 != 0) {
        pvVar6 = (pmVar5->m_central_dir).m_p;
        pvVar7 = (pmVar5->m_central_dir_offsets).m_p;
        uVar22 = 0;
        do {
          uVar11 = (ulong)*(uint *)((long)pvVar7 + uVar22 * 4);
          uVar2 = *(ushort *)((long)pvVar6 + uVar11 + 0x1c);
          uVar20 = (ulong)uVar2;
          if (sVar10 <= uVar20) {
            __s2 = (void *)((long)pvVar6 + uVar11 + 0x2e);
            if (__n != 0) {
              if (__n != *(ushort *)((long)pvVar6 + uVar11 + 0x20)) goto LAB_003b2b82;
              uVar16 = (ulong)*(ushort *)((long)pvVar6 + uVar11 + 0x1e);
              if ((flags >> 8 & 1) == 0) {
                sVar12 = 0;
                do {
                  bVar1 = pComment[sVar12];
                  iVar24 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar24 = (int)(char)bVar1;
                  }
                  bVar1 = *(byte *)((long)pvVar6 + sVar12 + uVar11 + uVar16 + uVar20 + 0x2e);
                  iVar15 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar15 = (int)(char)bVar1;
                  }
                  if (iVar24 != iVar15) goto LAB_003b2b82;
                  sVar12 = sVar12 + 1;
                } while (__n != sVar12);
              }
              else {
                iVar24 = bcmp(pComment,(void *)((long)__s2 + uVar20 + uVar16),__n);
                if (iVar24 != 0) goto LAB_003b2b82;
              }
            }
            if (((flags >> 9 & 1) != 0) && (uVar2 != 0)) {
              do {
                uVar17 = *(byte *)((long)__s2 + (uVar20 - 1 & 0xffffffff)) - 0x2f;
                if ((uVar17 < 0x2e) && ((0x200000000801U >> ((ulong)uVar17 & 0x3f) & 1) != 0))
                goto LAB_003b2b03;
                bVar8 = 1 < (long)uVar20;
                uVar20 = uVar20 - 1;
              } while (bVar8);
              uVar20 = 0;
LAB_003b2b03:
              __s2 = (void *)((long)__s2 + (uVar20 & 0xffffffff));
              uVar20 = (ulong)((uint)uVar2 - (int)uVar20);
            }
            if (sVar10 == uVar20) {
              if ((flags >> 8 & 1) == 0) {
                if ((int)uVar20 == 0) {
LAB_003b2ba7:
                  return (int)uVar22;
                }
                sVar12 = 0;
                while( true ) {
                  bVar1 = pName[sVar12];
                  iVar24 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar24 = (int)(char)bVar1;
                  }
                  bVar1 = *(byte *)((long)__s2 + sVar12);
                  iVar15 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar15 = (int)(char)bVar1;
                  }
                  if (iVar24 != iVar15) break;
                  sVar12 = sVar12 + 1;
                  if (sVar10 == sVar12) goto LAB_003b2ba7;
                }
              }
              else {
                iVar24 = bcmp(pName,__s2,sVar10);
                if (iVar24 == 0) goto LAB_003b2ba7;
              }
            }
          }
LAB_003b2b82:
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar4);
      }
    }
  }
  return -1;
}

Assistant:

int mz_zip_reader_locate_file(mz_zip_archive *pZip, const char *pName,
                              const char *pComment, mz_uint flags) {
  mz_uint file_index;
  size_t name_len, comment_len;
  if ((!pZip) || (!pZip->m_pState) || (!pName) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return -1;
  if (((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) &&
      (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    return mz_zip_reader_locate_file_binary_search(pZip, pName);
  name_len = strlen(pName);
  if (name_len > 0xFFFF)
    return -1;
  comment_len = pComment ? strlen(pComment) : 0;
  if (comment_len > 0xFFFF)
    return -1;
  for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
    const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(
        &pZip->m_pState->m_central_dir, mz_uint8,
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                             file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char *pFilename =
        (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len) {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS),
              file_comment_len =
                  MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char *pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) ||
          (!mz_zip_reader_string_equal(pComment, pFile_comment,
                                       file_comment_len, flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
      int ofs = filename_len - 1;
      do {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') ||
            (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs;
      filename_len -= ofs;
    }
    if ((filename_len == name_len) &&
        (mz_zip_reader_string_equal(pName, pFilename, filename_len, flags)))
      return file_index;
  }
  return -1;
}